

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidGetValidElements(xmlNode *prev,xmlNode *next,xmlChar **names,int max)

{
  xmlDtdPtr dtd;
  int iVar1;
  xmlNodePtr cur;
  _xmlNode **pp_Var2;
  long lVar3;
  xmlNode *pxVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  _xmlNode *elem;
  ulong uVar8;
  int nb_elements;
  int local_8fc;
  _xmlNode *local_8f8;
  _xmlNode *local_8f0;
  _xmlNode *local_8e8;
  _xmlNode *local_8e0;
  xmlChar *local_8d8;
  _xmlNode **local_8d0;
  xmlElementPtr local_8c8;
  _xmlNode *local_8c0;
  _xmlNode *local_8b8;
  _xmlNode *p_Stack_8b0;
  xmlValidCtxt vctxt;
  xmlChar *elements [256];
  
  memset(elements,0,0x800);
  nb_elements = 0;
  uVar7 = 0xffffffff;
  if (0 < max && (names != (xmlChar **)0x0 && (prev != (xmlNode *)0x0 || next != (xmlNode *)0x0))) {
    vctxt.userData = (void *)0x0;
    vctxt.am = (xmlAutomataPtr)0x0;
    vctxt.state = (xmlAutomataStatePtr)0x0;
    vctxt.vstateNr = 0;
    vctxt.vstateMax = 0;
    vctxt.vstateTab = (xmlValidState *)0x0;
    vctxt.valid = 0;
    vctxt._68_4_ = 0;
    vctxt.vstate = (xmlValidState *)0x0;
    vctxt.flags = 0;
    vctxt._52_4_ = 0;
    vctxt.doc = (xmlDocPtr)0x0;
    vctxt.nodeNr = 0;
    vctxt.nodeMax = 0;
    vctxt.nodeTab = (xmlNodePtr *)0x0;
    vctxt.warning = (xmlValidityWarningFunc)0x0;
    vctxt.node = (xmlNodePtr)0x0;
    vctxt.error = xmlNoValidityErr;
    pxVar4 = prev;
    if (prev == (xmlNode *)0x0) {
      pxVar4 = next;
    }
    elem = pxVar4->parent;
    local_8fc = max;
    local_8c8 = xmlGetDtdElementDesc(elem->doc->intSubset,elem->name);
    if ((local_8c8 != (xmlElementPtr)0x0) ||
       ((dtd = elem->doc->extSubset, dtd != (xmlDtdPtr)0x0 &&
        (local_8c8 = xmlGetDtdElementDesc(dtd,elem->name), local_8c8 != (xmlElementPtr)0x0)))) {
      if (prev == (xmlNode *)0x0) {
        local_8f0 = (_xmlNode *)0x0;
      }
      else {
        local_8f0 = prev->next;
      }
      if (next == (xmlNode *)0x0) {
        local_8f8 = (_xmlNode *)0x0;
      }
      else {
        local_8f8 = next->prev;
      }
      local_8b8 = elem->children;
      p_Stack_8b0 = elem->last;
      lVar6 = 0;
      local_8e8 = prev;
      local_8e0 = next;
      cur = xmlNewDocNode(pxVar4->doc,(xmlNsPtr)0x0,(xmlChar *)"<!dummy?>",(xmlChar *)0x0);
      if (cur != (xmlNodePtr)0x0) {
        local_8d0 = &elem->children;
        pp_Var2 = &local_8e8->next;
        if (local_8e8 == (_xmlNode *)0x0) {
          pp_Var2 = local_8d0;
        }
        cur->parent = elem;
        cur->prev = local_8e8;
        cur->next = local_8e0;
        local_8d8 = cur->name;
        *pp_Var2 = cur;
        pp_Var2 = &local_8e0->prev;
        if (local_8e0 == (_xmlNode *)0x0) {
          pp_Var2 = &elem->last;
        }
        *pp_Var2 = cur;
        nb_elements = xmlValidGetPotentialChildren(local_8c8->content,elements,&nb_elements,0x100);
        uVar5 = 0;
        local_8c0 = elem;
        for (; uVar7 = (uint)uVar5, lVar6 < nb_elements; lVar6 = lVar6 + 1) {
          cur->name = elements[lVar6];
          iVar1 = xmlValidateOneElement(&vctxt,elem->doc,elem);
          if (iVar1 != 0) {
            uVar8 = 0;
            if (0 < (int)uVar7) {
              uVar8 = uVar5;
            }
            uVar5 = 0;
            do {
              if (uVar8 == uVar5) break;
              iVar1 = xmlStrEqual(elements[lVar6],names[uVar5]);
              uVar5 = uVar5 + 1;
            } while (iVar1 == 0);
            lVar3 = (long)(int)uVar7;
            uVar7 = uVar7 + 1;
            uVar5 = (ulong)uVar7;
            names[lVar3] = elements[lVar6];
            elem = local_8c0;
            if (local_8fc <= (int)uVar7) break;
          }
        }
        if (local_8e8 != (_xmlNode *)0x0) {
          local_8e8->next = local_8f0;
        }
        if (local_8e0 != (_xmlNode *)0x0) {
          local_8e0->prev = local_8f8;
        }
        *local_8d0 = local_8b8;
        local_8d0[1] = p_Stack_8b0;
        cur->name = local_8d8;
        xmlFreeNode(cur);
      }
    }
  }
  return uVar7;
}

Assistant:

int
xmlValidGetValidElements(xmlNode *prev, xmlNode *next, const xmlChar **names,
                         int max) {
    xmlValidCtxt vctxt;
    int nb_valid_elements = 0;
    const xmlChar *elements[256]={0};
    int nb_elements = 0, i;
    const xmlChar *name;

    xmlNode *ref_node;
    xmlNode *parent;
    xmlNode *test_node;

    xmlNode *prev_next;
    xmlNode *next_prev;
    xmlNode *parent_childs;
    xmlNode *parent_last;

    xmlElement *element_desc;

    if (prev == NULL && next == NULL)
        return(-1);

    if (names == NULL) return(-1);
    if (max <= 0) return(-1);

    memset(&vctxt, 0, sizeof (xmlValidCtxt));
    vctxt.error = xmlNoValidityErr;	/* this suppresses err/warn output */

    nb_valid_elements = 0;
    ref_node = prev ? prev : next;
    parent = ref_node->parent;

    /*
     * Retrieves the parent element declaration
     */
    element_desc = xmlGetDtdElementDesc(parent->doc->intSubset,
                                         parent->name);
    if ((element_desc == NULL) && (parent->doc->extSubset != NULL))
        element_desc = xmlGetDtdElementDesc(parent->doc->extSubset,
                                             parent->name);
    if (element_desc == NULL) return(-1);

    /*
     * Do a backup of the current tree structure
     */
    prev_next = prev ? prev->next : NULL;
    next_prev = next ? next->prev : NULL;
    parent_childs = parent->children;
    parent_last = parent->last;

    /*
     * Creates a dummy node and insert it into the tree
     */
    test_node = xmlNewDocNode (ref_node->doc, NULL, BAD_CAST "<!dummy?>", NULL);
    if (test_node == NULL)
        return(-1);

    test_node->parent = parent;
    test_node->prev = prev;
    test_node->next = next;
    name = test_node->name;

    if (prev) prev->next = test_node;
    else parent->children = test_node;

    if (next) next->prev = test_node;
    else parent->last = test_node;

    /*
     * Insert each potential child node and check if the parent is
     * still valid
     */
    nb_elements = xmlValidGetPotentialChildren(element_desc->content,
		       elements, &nb_elements, 256);

    for (i = 0;i < nb_elements;i++) {
	test_node->name = elements[i];
	if (xmlValidateOneElement(&vctxt, parent->doc, parent)) {
	    int j;

	    for (j = 0; j < nb_valid_elements;j++)
		if (xmlStrEqual(elements[i], names[j])) break;
	    names[nb_valid_elements++] = elements[i];
	    if (nb_valid_elements >= max) break;
	}
    }

    /*
     * Restore the tree structure
     */
    if (prev) prev->next = prev_next;
    if (next) next->prev = next_prev;
    parent->children = parent_childs;
    parent->last = parent_last;

    /*
     * Free up the dummy node
     */
    test_node->name = name;
    xmlFreeNode(test_node);

    return(nb_valid_elements);
}